

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall
GslSpan_FromStdArrayConstructor_Test::~GslSpan_FromStdArrayConstructor_Test
          (GslSpan_FromStdArrayConstructor_Test *this)

{
  GslSpan_FromStdArrayConstructor_Test *this_local;
  
  ~GslSpan_FromStdArrayConstructor_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, FromStdArrayConstructor) {
    std::array<int, 4> arr = {{1, 2, 3, 4}};

    {
        span<int> s{arr};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());

        span<int, 4> cs{arr};
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (cs.data (), arr.data ());
    }
    {
        span<int, 4> s{arr};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());

        span<int const, 4> cs{arr};
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (cs.data (), arr.data ());
    }

#ifdef CONFIRM_COMPILATION_ERRORS
    {
        span<int, 2> s{arr};
        EXPECT_EQ (s.size () == 2 && s.data (), arr.data ());

        span<const int, 2> cs{arr};
        EXPECT_EQ (cs.size () == 2 && cs.data (), arr.data ());
    }
    {
        span<int, 0> s{arr};
        EXPECT_EQ (s.size () == 0 && s.data (), arr.data ());

        span<const int, 0> cs{arr};
        EXPECT_EQ (cs.size () == 0 && cs.data (), arr.data ());
    }
    { span<int, 5> s{arr}; }
    {
        auto get_an_array = [] () -> std::array<int, 4> { return {1, 2, 3, 4}; };
        auto take_a_span = [] (span<int> s) { static_cast<void> (s); };
        // try to take a temporary std::array
        take_a_span (get_an_array ());
    }
#endif

    {
        auto get_an_array = [] () -> std::array<int, 4> { return {{1, 2, 3, 4}}; };
        auto take_a_span = [] (span<int const> s) { static_cast<void> (s); };
        // try to take a temporary std::array
        take_a_span (span<int const, 4>{get_an_array ()});
    }
    {
        auto s = make_span (arr);
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());
    }
}